

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O3

void free_cache(VMEMcache *cache)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long in_RCX;
  void *extraout_RDX;
  os_thread_t *thread;
  uint uVar4;
  uint *puVar5;
  ulong uVar7;
  os_thread_t *thread_00;
  void *arg;
  ulong uVar8;
  undefined1 auStack_188 [264];
  long lStack_80;
  undefined8 uStack_78;
  VMEMcache *pVStack_70;
  stat_t local_38;
  stat_t entries;
  stat_t heap_entries;
  stat_t dram;
  stat_t pool_ued;
  undefined8 uVar6;
  
  do {
    iVar1 = vmemcache_evict(cache,0,0);
  } while (iVar1 == 0);
  get_stat(cache,&local_38,VMEMCACHE_STAT_ENTRIES);
  get_stat(cache,&entries,VMEMCACHE_STAT_HEAP_ENTRIES);
  get_stat(cache,&heap_entries,VMEMCACHE_STAT_DRAM_SIZE_USED);
  get_stat(cache,&dram,VMEMCACHE_STAT_POOL_SIZE_USED);
  if (local_38 == 0) {
    if (heap_entries != 0) goto LAB_001037c2;
    if (dram == 0) {
      if (entries == 1) {
        return;
      }
      goto LAB_001037d4;
    }
  }
  else {
    free_cache_cold_1();
LAB_001037c2:
    free_cache_cold_2();
  }
  free_cache_cold_3();
LAB_001037d4:
  free_cache_cold_4();
  puVar5 = *(uint **)(in_RCX + 8);
  iVar1 = vmemcache_put();
  if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 0x11)) {
    on_miss_cb_cold_1();
    uStack_78 = 0;
    if (puVar5[7] != 0) {
      uVar7 = 0;
      pVStack_70 = cache;
      do {
        lStack_80 = ((ulong)*puVar5 << 0x30) + uVar7;
        uVar6 = *(undefined8 *)(puVar5 + 2);
        thread = (os_thread_t *)(auStack_188 + 0x108);
        lVar3 = vmemcache_get(uVar6,(os_thread_t *)(auStack_188 + 0x108),8,auStack_188,0x100,0,
                              &uStack_78);
        uVar4 = (uint)uVar6;
        if (lVar3 == -1) {
          worker_thread_get_unique_keys_cold_1();
          if (uVar4 != 0) {
            uVar8 = (ulong)uVar4;
            thread_00 = thread;
            uVar7 = uVar8;
            arg = extraout_RDX;
            do {
              os_thread_create(thread_00,(os_thread_attr_t *)0x0,
                               *(_func_void_ptr_void_ptr **)((long)arg + 0x20),arg);
              thread_00 = thread_00 + 1;
              arg = (void *)((long)arg + 0x28);
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
            if (uVar4 != 0) {
              do {
                os_thread_join(thread,(void **)0x0);
                thread = thread + 1;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
          }
          return;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < puVar5[7]);
    }
    return;
  }
  return;
}

Assistant:

static void
free_cache(VMEMcache *cache)
{
	/* evict all entries from the cache */
	while (vmemcache_evict(cache, NULL, 0) == 0)
		;

#ifdef STATS_ENABLED
	/* verify that all memory is freed */
	stat_t entries, heap_entries, dram, pool_ued;
	get_stat(cache, &entries, VMEMCACHE_STAT_ENTRIES);
	get_stat(cache, &heap_entries, VMEMCACHE_STAT_HEAP_ENTRIES);
	get_stat(cache, &dram, VMEMCACHE_STAT_DRAM_SIZE_USED);
	get_stat(cache, &pool_ued, VMEMCACHE_STAT_POOL_SIZE_USED);

	if (entries != 0)
		UT_FATAL("%llu entries were not freed", entries);
	if (dram != 0)
		UT_FATAL("%llu bytes of DRAM memory were not freed", dram);
	if (pool_ued != 0)
		UT_FATAL("%llu bytes of pool memory were not freed", pool_ued);
	if (heap_entries != 1)
		UT_FATAL("%llu heap entries were not merged", heap_entries - 1);
#endif /* STATS_ENABLED */
}